

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O1

char * nng_str_sockaddr(nng_sockaddr *sa,char *buf,size_t bufsz)

{
  uint32_t uVar1;
  char *__format;
  char *pcVar2;
  char local_58 [48];
  
  switch(sa->s_family) {
  case 1:
    pcVar2 = (sa->s_ipc).sa_path;
    __format = "inproc[%s]";
    break;
  case 2:
    pcVar2 = (sa->s_ipc).sa_path;
    __format = "%s";
    break;
  case 3:
    snprintf(buf,bufsz,"%u.%u.%u.%u:%u",(ulong)(sa->s_in6).sa_addr[0],(ulong)(sa->s_in6).sa_addr[1],
             (ulong)(sa->s_in6).sa_addr[2],(ulong)(sa->s_in6).sa_addr[3],
             (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
    return buf;
  case 4:
    uVar1 = (sa->s_in6).sa_scope;
    nni_inet_ntop((sa->s_in6).sa_addr,local_58);
    if (uVar1 != 0) {
      snprintf(buf,bufsz,"[%s%%%u]:%u",local_58,(ulong)(sa->s_in6).sa_scope,
               (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
      return buf;
    }
    snprintf(buf,bufsz,"[%s]:%u",local_58,
             (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
    return buf;
  case 5:
    pcVar2 = (sa->s_ipc).sa_path + 2;
    __format = "abstract[%s]";
    break;
  default:
    return "unknown";
  }
  snprintf(buf,bufsz,__format,pcVar2);
  return buf;
}

Assistant:

const char *
nng_str_sockaddr(const nng_sockaddr *sa, char *buf, size_t bufsz)
{
	switch (sa->s_family) {
	case NNG_AF_INPROC:
		return (str_sa_inproc(&sa->s_inproc, buf, bufsz));
	case NNG_AF_INET:
		return (str_sa_inet(&sa->s_in, buf, bufsz));
	case NNG_AF_INET6:
		return (str_sa_inet6(&sa->s_in6, buf, bufsz));
	case NNG_AF_IPC:
		return (str_sa_ipc(&sa->s_ipc, buf, bufsz));
	case NNG_AF_ABSTRACT:
		return (str_sa_abstract(&sa->s_abstract, buf, bufsz));
	case NNG_AF_UNSPEC:
	default:
		return ("unknown");
	}
}